

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_basic.c
# Opt level: O1

int main(void)

{
  int iVar1;
  TD_runtests *t;
  Task local_48;
  
  lace_start(1,0);
  sylvan_set_sizes(0x100000,0x100000,0x10000,0x10000);
  sylvan_init_package();
  sylvan_init_mtbdd();
  sylvan_init_mtbdd();
  sylvan_init_ldd();
  puts("Sylvan initialization complete.");
  local_48.f = runtests_WRAP;
  local_48.thief = (_Worker *)0x1;
  lace_run_task(&local_48);
  sylvan_quit();
  lace_stop();
  iVar1._0_1_ = local_48.d[0];
  iVar1._1_1_ = local_48.d[1];
  iVar1._2_1_ = local_48.d[2];
  iVar1._3_1_ = local_48.d[3];
  return iVar1;
}

Assistant:

int main()
{
    // Standard Lace initialization with 1 worker
    lace_start(1, 0);

    // Simple Sylvan initialization, also initialize BDD, MTBDD and LDD support
    sylvan_set_sizes(1LL<<20, 1LL<<20, 1LL<<16, 1LL<<16);
    sylvan_init_package();
    sylvan_init_bdd();
    sylvan_init_mtbdd();
    sylvan_init_ldd();

    printf("Sylvan initialization complete.\n");

    int res = RUN(runtests);

    sylvan_quit();
    lace_stop();

    return res;
}